

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Write<short>(KDataStream *this,short T)

{
  NetToDataType<short> local_18;
  byte local_17;
  NetToDataType<short> local_16 [4];
  short local_12;
  KUINT8 i;
  NetToDataType<short> OctArray;
  KBOOL bSwapBytes;
  KDataStream *pKStack_10;
  short T_local;
  KDataStream *this_local;
  
  local_16[3] = (NetToDataType<short>)(this->m_MachineEndian != this->m_NetEndian);
  local_12 = T;
  pKStack_10 = this;
  NetToDataType<short>::NetToDataType(local_16,T,(KBOOL)local_16[3]);
  for (local_17 = 0; local_17 < 2; local_17 = local_17 + 1) {
    local_18 = local_16[local_17];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vBuffer,(value_type_conflict1 *)&local_18);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}